

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperMatch.c
# Opt level: O0

void Map_NodeTransferArrivalTimes(Map_Man_t *p,Map_Node_t *pNode)

{
  float *pfVar1;
  float fVar2;
  Map_Cut_t *pMVar3;
  float local_20;
  float local_1c;
  Map_Node_t *pNode_local;
  Map_Man_t *p_local;
  
  if ((pNode->pCutBest[0] == (Map_Cut_t *)0x0) || (pNode->pCutBest[1] == (Map_Cut_t *)0x0)) {
    if (pNode->pCutBest[0] == (Map_Cut_t *)0x0) {
      if (pNode->pCutBest[1] == (Map_Cut_t *)0x0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mapper/mapperMatch.c"
                      ,0x21b,"void Map_NodeTransferArrivalTimes(Map_Man_t *, Map_Node_t *)");
      }
      pMVar3 = pNode->pCutBest[1];
      fVar2 = pMVar3->M[1].tArrive.Fall;
      pNode->tArrival[1].Rise = pMVar3->M[1].tArrive.Rise;
      pNode->tArrival[1].Fall = fVar2;
      pNode->tArrival[1].Worst = pMVar3->M[1].tArrive.Worst;
      pNode->tArrival[0].Rise = pNode->tArrival[1].Fall + (p->pSuperLib->tDelayInv).Rise;
      pNode->tArrival[0].Fall = pNode->tArrival[1].Rise + (p->pSuperLib->tDelayInv).Fall;
      fVar2 = pNode->tArrival[0].Rise;
      pfVar1 = &pNode->tArrival[0].Fall;
      if (fVar2 < *pfVar1 || fVar2 == *pfVar1) {
        local_20 = pNode->tArrival[0].Fall;
      }
      else {
        local_20 = pNode->tArrival[0].Rise;
      }
      pNode->tArrival[0].Worst = local_20;
    }
    else {
      pMVar3 = pNode->pCutBest[0];
      fVar2 = pMVar3->M[0].tArrive.Fall;
      pNode->tArrival[0].Rise = pMVar3->M[0].tArrive.Rise;
      pNode->tArrival[0].Fall = fVar2;
      pNode->tArrival[0].Worst = pMVar3->M[0].tArrive.Worst;
      pNode->tArrival[1].Rise = pNode->tArrival[0].Fall + (p->pSuperLib->tDelayInv).Rise;
      pNode->tArrival[1].Fall = pNode->tArrival[0].Rise + (p->pSuperLib->tDelayInv).Fall;
      fVar2 = pNode->tArrival[1].Rise;
      pfVar1 = &pNode->tArrival[1].Fall;
      if (fVar2 < *pfVar1 || fVar2 == *pfVar1) {
        local_1c = pNode->tArrival[1].Fall;
      }
      else {
        local_1c = pNode->tArrival[1].Rise;
      }
      pNode->tArrival[1].Worst = local_1c;
    }
  }
  else {
    pMVar3 = pNode->pCutBest[0];
    fVar2 = pMVar3->M[0].tArrive.Fall;
    pNode->tArrival[0].Rise = pMVar3->M[0].tArrive.Rise;
    pNode->tArrival[0].Fall = fVar2;
    pNode->tArrival[0].Worst = pMVar3->M[0].tArrive.Worst;
    pMVar3 = pNode->pCutBest[1];
    fVar2 = pMVar3->M[1].tArrive.Fall;
    pNode->tArrival[1].Rise = pMVar3->M[1].tArrive.Rise;
    pNode->tArrival[1].Fall = fVar2;
    pNode->tArrival[1].Worst = pMVar3->M[1].tArrive.Worst;
  }
  return;
}

Assistant:

void Map_NodeTransferArrivalTimes( Map_Man_t * p, Map_Node_t * pNode )
{
    // if both phases are available, set their arrival times
    if ( pNode->pCutBest[0] && pNode->pCutBest[1] )
    {
        pNode->tArrival[0] = pNode->pCutBest[0]->M[0].tArrive;
        pNode->tArrival[1] = pNode->pCutBest[1]->M[1].tArrive;
    }
    // if only one phase is available, compute the arrival time of other phase
    else if ( pNode->pCutBest[0] )
    {
        pNode->tArrival[0] = pNode->pCutBest[0]->M[0].tArrive;
        pNode->tArrival[1].Rise  = pNode->tArrival[0].Fall + p->pSuperLib->tDelayInv.Rise;
        pNode->tArrival[1].Fall  = pNode->tArrival[0].Rise + p->pSuperLib->tDelayInv.Fall;
        pNode->tArrival[1].Worst = MAP_MAX(pNode->tArrival[1].Rise, pNode->tArrival[1].Fall);
    }
    else if ( pNode->pCutBest[1] )
    {
        pNode->tArrival[1] = pNode->pCutBest[1]->M[1].tArrive;
        pNode->tArrival[0].Rise  = pNode->tArrival[1].Fall + p->pSuperLib->tDelayInv.Rise;
        pNode->tArrival[0].Fall  = pNode->tArrival[1].Rise + p->pSuperLib->tDelayInv.Fall;
        pNode->tArrival[0].Worst = MAP_MAX(pNode->tArrival[0].Rise, pNode->tArrival[0].Fall);
    }
    else 
    {
        assert( 0 );
    }

//    assert( pNode->tArrival[0].Rise < pNode->tRequired[0].Rise + p->fEpsilon );
//    assert( pNode->tArrival[0].Fall < pNode->tRequired[0].Fall + p->fEpsilon );

//    assert( pNode->tArrival[1].Rise < pNode->tRequired[1].Rise + p->fEpsilon );
//    assert( pNode->tArrival[1].Fall < pNode->tRequired[1].Fall + p->fEpsilon );
}